

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_lock.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint local_14;
  uint local_10;
  uint i_1;
  uint i;
  
  iVar1 = mtx_init(&g_mutex,0);
  if (iVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
           ,0x3b,"mtx_init( &g_mutex, mtx_plain ) == thrd_success");
  }
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    iVar1 = thrd_create(g_thread + local_10,func,(void *)0x0);
    if (iVar1 != 1) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
             ,0x3f,"thrd_create( &g_thread[i], func, NULL ) == thrd_success");
    }
  }
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    iVar1 = thrd_join(g_thread[local_14],(int *)0x0);
    if (iVar1 != 1) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
             ,0x44,"thrd_join( g_thread[i], NULL ) == thrd_success");
    }
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( mtx_init( &g_mutex, mtx_plain ) == thrd_success );

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_create( &g_thread[i], func, NULL ) == thrd_success );
    }

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_join( g_thread[i], NULL ) == thrd_success );
    }

#endif
    return TEST_RESULTS;
}